

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall
hwtest::pgraph::MthdCelsiusSpecularEnable::adjust_orig_mthd(MthdCelsiusSpecularEnable *this)

{
  mt19937 *this_00;
  uint32_t *puVar1;
  byte *pbVar2;
  uint32_t uVar3;
  result_type rVar4;
  
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar4 & 1) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.val =
         (uint)(ushort)(this->super_SingleMthdTest).super_MthdTest.val;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 1) != 0) {
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
      *puVar1 = *puVar1 & 0xf;
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 1) != 0) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
      *puVar1 = *puVar1 | 1 << ((byte)rVar4 & 0x1f);
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 1) != 0) {
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
        *puVar1 = *puVar1 | 1 << ((byte)rVar4 & 0x1f);
      }
    }
  }
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.celsius_pipe_begin_end;
  if ((uVar3 == 10) || (uVar3 == 3)) {
    pbVar2 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                             celsius_pipe_vtx_state + 3);
    *pbVar2 = *pbVar2 & 0x8f;
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xffff;
			if (rnd() & 1) {
				val &= 0xf;
			}
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
		adjust_orig_icmd(&orig);
	}